

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O3

QString * __thiscall
QWidgetLineControl::surroundingText(QString *__return_storage_ptr__,QWidgetLineControl *this)

{
  char16_t *pcVar1;
  Data *pDVar2;
  QByteArrayView QVar3;
  
  pcVar1 = *(char16_t **)(this + 0x20);
  if (pcVar1 == (char16_t *)0x0) {
    QVar3.m_data = (storage_type *)0x0;
    QVar3.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar3);
  }
  else {
    pDVar2 = *(Data **)(this + 0x18);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar1;
    (__return_storage_ptr__->d).size = *(qsizetype *)(this + 0x28);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString surroundingText() const
    {
        return m_text.isNull() ? QString::fromLatin1("") : m_text;
    }